

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O0

void __thiscall jpgd::jpeg_decoder::H1V2ConvertFiltered(jpeg_decoder *this)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  long lVar5;
  uint8 uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  long in_RDI;
  int bc;
  int gc;
  int rc;
  int cr;
  int cb;
  int cr1_sample;
  int cb1_sample;
  int b;
  int cr0_sample;
  int cb0_sample;
  int a;
  int y_sample;
  int base_ofs;
  int x;
  int y1_base;
  int y0_base;
  int y_sample_base_ofs;
  uint8_t *p_C0Samples;
  uint8_t *p_YSamples;
  int c_y1;
  int c_y0;
  int w1;
  int w0;
  uint8 *d0;
  int half_image_y_size;
  int row;
  int y;
  uint BLOCKS_PER_MCU;
  int in_stack_ffffffffffffff3c;
  jpeg_decoder *this_00;
  int local_50;
  long local_40;
  jpeg_decoder *local_38;
  uint8 *local_20;
  
  uVar10 = *(int *)(in_RDI + 0xdc) - *(int *)(in_RDI + 0x284);
  uVar11 = uVar10 & 0xf;
  local_20 = *(uint8 **)(in_RDI + 0x34b8);
  iVar7 = 1;
  if ((uVar10 & 1) != 0) {
    iVar7 = 3;
  }
  iVar8 = 3;
  if ((uVar10 & 1) != 0) {
    iVar8 = 1;
  }
  local_38 = *(jpeg_decoder **)(in_RDI + 0x24a8);
  local_40 = *(long *)(in_RDI + 0x24a8);
  if ((-1 < (int)(uVar10 - 1) >> 1) &&
     (((uVar11 == 0 || (uVar11 == 0xf)) && (1 < *(int *)(in_RDI + 0x284))))) {
    if ((int)uVar10 < 1) {
      __assert_fail("y > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/jpgd.cpp"
                    ,0x6be,"void jpgd::jpeg_decoder::H1V2ConvertFiltered()");
    }
    if ((*(byte *)(in_RDI + 0x34d2) & 1) == 0) {
      __assert_fail("m_sample_buf_prev_valid",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/jpgd.cpp"
                    ,0x6bf,"void jpgd::jpeg_decoder::H1V2ConvertFiltered()");
    }
    if (uVar11 == 0xf) {
      local_38 = *(jpeg_decoder **)(in_RDI + 0x24b0);
    }
    local_40 = *(long *)(in_RDI + 0x24b0);
  }
  for (local_50 = 0; local_50 < *(int *)(in_RDI + 0xd8); local_50 = local_50 + 1) {
    this_00 = local_38;
    iVar9 = check_sample_buf_ofs(local_38,in_stack_ffffffffffffff3c);
    uVar10 = (uint)*(byte *)((long)this_00->m_jmp_state[0].__jmpbuf + (long)iVar9);
    iVar9 = check_sample_buf_ofs(this_00,in_stack_ffffffffffffff3c);
    bVar1 = *(byte *)(local_40 + iVar9);
    iVar9 = check_sample_buf_ofs(this_00,in_stack_ffffffffffffff3c);
    bVar2 = *(byte *)(local_40 + iVar9);
    lVar5 = *(long *)(in_RDI + 0x24a8);
    iVar9 = check_sample_buf_ofs(this_00,in_stack_ffffffffffffff3c);
    bVar3 = *(byte *)(lVar5 + iVar9);
    lVar5 = *(long *)(in_RDI + 0x24a8);
    iVar9 = check_sample_buf_ofs(this_00,in_stack_ffffffffffffff3c);
    iVar12 = (int)((uint)bVar1 * iVar7 + (uint)bVar3 * iVar8 + 2) >> 2;
    iVar13 = (int)((uint)bVar2 * iVar7 + (uint)*(byte *)(lVar5 + iVar9) * iVar8 + 2) >> 2;
    iVar9 = *(int *)(in_RDI + 0x2cb8 + (long)iVar13 * 4);
    iVar4 = *(int *)(in_RDI + 0x30b8 + (long)iVar12 * 4);
    iVar12 = *(int *)(in_RDI + 0x28b8 + (long)iVar12 * 4);
    uVar6 = clamp(uVar10 + *(int *)(in_RDI + 0x24b8 + (long)iVar13 * 4));
    *local_20 = uVar6;
    uVar6 = clamp(uVar10 + (iVar9 + iVar4 >> 0x10));
    local_20[1] = uVar6;
    uVar6 = clamp(uVar10 + iVar12);
    local_20[2] = uVar6;
    local_20[3] = 0xff;
    local_20 = local_20 + 4;
  }
  return;
}

Assistant:

void jpeg_decoder::H1V2ConvertFiltered()
	{
		const uint BLOCKS_PER_MCU = 4;
		int y = m_image_y_size - m_total_lines_left;
		int row = y & 15;

		const int half_image_y_size = (m_image_y_size >> 1) - 1;

		uint8* d0 = m_pScan_line_0;

		const int w0 = (row & 1) ? 3 : 1;
		const int w1 = (row & 1) ? 1 : 3;

		int c_y0 = (y - 1) >> 1;
		int c_y1 = JPGD_MIN(c_y0 + 1, half_image_y_size);

		const uint8_t* p_YSamples = m_pSample_buf;
		const uint8_t* p_C0Samples = m_pSample_buf;
		if ((c_y0 >= 0) && (((row & 15) == 0) || ((row & 15) == 15)) && (m_total_lines_left > 1))
		{
			assert(y > 0);
			assert(m_sample_buf_prev_valid);

			if ((row & 15) == 15)
				p_YSamples = m_pSample_buf_prev;

			p_C0Samples = m_pSample_buf_prev;
		}

		const int y_sample_base_ofs = ((row & 8) ? 64 : 0) + (row & 7) * 8;
		const int y0_base = (c_y0 & 7) * 8 + 128;
		const int y1_base = (c_y1 & 7) * 8 + 128;

		for (int x = 0; x < m_image_x_size; x++)
		{
			const int base_ofs = (x >> 3) * BLOCKS_PER_MCU * 64 + (x & 7);

			int y_sample = p_YSamples[check_sample_buf_ofs(base_ofs + y_sample_base_ofs)];

			int a = base_ofs + y0_base;
			int cb0_sample = p_C0Samples[check_sample_buf_ofs(a)];
			int cr0_sample = p_C0Samples[check_sample_buf_ofs(a + 64)];

			int b = base_ofs + y1_base;
			int cb1_sample = m_pSample_buf[check_sample_buf_ofs(b)];
			int cr1_sample = m_pSample_buf[check_sample_buf_ofs(b + 64)];

			int cb = (cb0_sample * w0 + cb1_sample * w1 + 2) >> 2;
			int cr = (cr0_sample * w0 + cr1_sample * w1 + 2) >> 2;

			int rc = m_crr[cr];
			int gc = ((m_crg[cr] + m_cbg[cb]) >> 16);
			int bc = m_cbb[cb];

			d0[0] = clamp(y_sample + rc);
			d0[1] = clamp(y_sample + gc);
			d0[2] = clamp(y_sample + bc);
			d0[3] = 255;

			d0 += 4;
		}
	}